

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sampler.cpp
# Opt level: O2

Ptr<Sampler> __thiscall
myvk::Sampler::CreateClampToBorder
          (Sampler *this,Ptr<Device> *device,VkFilter filter,VkBorderColor border_color,
          VkSamplerMipmapMode mipmap_mode,float max_lod,bool request_anisotropy,float max_anisotropy
          )

{
  bool bVar1;
  Ptr<Sampler> PVar2;
  VkSamplerCreateInfo local_58;
  
  local_58.pNext = (void *)0x0;
  local_58.sType = VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO;
  local_58._4_4_ = 0;
  local_58._16_8_ = (ulong)filter << 0x20;
  local_58.mipmapMode = mipmap_mode;
  local_58.minFilter = filter;
  local_58.addressModeU = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_BORDER;
  local_58.addressModeV = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_BORDER;
  local_58.addressModeW = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_BORDER;
  local_58.mipLodBias = 0.0;
  local_58.unnormalizedCoordinates = 0;
  local_58.borderColor = border_color;
  local_58.compareEnable = 0;
  local_58.compareOp = VK_COMPARE_OP_NEVER;
  local_58._64_8_ = (ulong)(uint)max_lod << 0x20;
  bVar1 = (((device->super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
          m_features).vk10.samplerAnisotropy != 0;
  if (!bVar1) {
    max_anisotropy = 1.0;
  }
  local_58.maxAnisotropy = max_anisotropy;
  local_58.anisotropyEnable = (uint)(bVar1 && request_anisotropy);
  PVar2 = Create(this,device,&local_58);
  PVar2.super___shared_ptr<myvk::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr<Sampler>)PVar2.super___shared_ptr<myvk::Sampler,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<Sampler> Sampler::CreateClampToBorder(const Ptr<Device> &device, VkFilter filter, VkBorderColor border_color,
                                          VkSamplerMipmapMode mipmap_mode, float max_lod, bool request_anisotropy,
                                          float max_anisotropy) {
	VkSamplerCreateInfo create_info = {};
	create_info.sType = VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO;
	create_info.magFilter = filter;
	create_info.minFilter = filter;
	create_info.mipmapMode = mipmap_mode;
	create_info.addressModeU = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_BORDER;
	create_info.addressModeV = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_BORDER;
	create_info.addressModeW = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_BORDER;
	create_info.borderColor = border_color;
	create_info.mipLodBias = 0.0f;
	create_info.compareOp = VK_COMPARE_OP_NEVER;
	create_info.minLod = 0.0f;
	create_info.maxLod = max_lod;
	if (device->GetEnabledFeatures().vk10.samplerAnisotropy) {
		create_info.anisotropyEnable = request_anisotropy ? VK_TRUE : VK_FALSE;
		create_info.maxAnisotropy = max_anisotropy;
	} else {
		create_info.maxAnisotropy = 1.0;
		create_info.anisotropyEnable = VK_FALSE;
	}

	return Create(device, create_info);
}